

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_read_support_format_rar5.c
# Opt level: O0

wchar_t cdeque_pop_front(cdeque *d,void **value)

{
  void **value_local;
  cdeque *d_local;
  
  if ((d == (cdeque *)0x0) || (value == (void **)0x0)) {
    d_local._4_4_ = L'\x02';
  }
  else if (d->size == 0) {
    d_local._4_4_ = L'\x03';
  }
  else {
    cdeque_pop_front_fast(d,value);
    d_local._4_4_ = L'\0';
  }
  return d_local._4_4_;
}

Assistant:

static int cdeque_pop_front(struct cdeque* d, void** value) {
	if(!d || !value)
		return CDE_PARAM;

	if(d->size == 0)
		return CDE_OUT_OF_BOUNDS;

	cdeque_pop_front_fast(d, value);
	return CDE_OK;
}